

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

UBool isAcceptable(void *context,char *param_2,char *param_3,UDataInfo *pInfo)

{
  bool local_2a;
  bool local_29;
  UDataInfo *pInfo_local;
  char *param_2_local;
  char *param_1_local;
  void *context_local;
  
  *(undefined4 *)context = *(undefined4 *)pInfo->formatVersion;
  local_29 = false;
  if (((((0x13 < pInfo->size) && (local_29 = false, pInfo->isBigEndian == '\0')) &&
       (local_29 = false, pInfo->charsetFamily == '\0')) &&
      ((local_29 = false, pInfo->sizeofUChar == '\x02' &&
       (local_29 = false, pInfo->dataFormat[0] == 'R')))) &&
     ((local_29 = false, pInfo->dataFormat[1] == 'e' &&
      ((local_29 = false, pInfo->dataFormat[2] == 's' &&
       (local_29 = false, pInfo->dataFormat[3] == 'B')))))) {
    local_2a = false;
    if (pInfo->formatVersion[0] != '\0') {
      local_2a = pInfo->formatVersion[0] < 4;
    }
    local_29 = local_2a;
  }
  return local_29;
}

Assistant:

static UBool U_CALLCONV
isAcceptable(void *context,
             const char * /*type*/, const char * /*name*/,
             const UDataInfo *pInfo) {
    uprv_memcpy(context, pInfo->formatVersion, 4);
    return (UBool)(
        pInfo->size>=20 &&
        pInfo->isBigEndian==U_IS_BIG_ENDIAN &&
        pInfo->charsetFamily==U_CHARSET_FAMILY &&
        pInfo->sizeofUChar==U_SIZEOF_UCHAR &&
        pInfo->dataFormat[0]==0x52 &&   /* dataFormat="ResB" */
        pInfo->dataFormat[1]==0x65 &&
        pInfo->dataFormat[2]==0x73 &&
        pInfo->dataFormat[3]==0x42 &&
        (1<=pInfo->formatVersion[0] && pInfo->formatVersion[0]<=3));
}